

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O0

ImColor ImColor_HSV(ImColor *self,float h,float s,float v,float a)

{
  ImVec4 IVar1;
  float a_local;
  float v_local;
  float s_local;
  float h_local;
  ImColor *self_local;
  
  IVar1 = (ImVec4)ImColor::HSV(h,s,v,a);
  return (ImColor)IVar1;
}

Assistant:

CIMGUI_API ImColor *_ImColor_HSV (ImColor *larg1, float larg2, float larg3, float larg4, float larg5) {
  ImColor * lresult = (ImColor *)0 ;
  ImColor *arg1 = (ImColor *) 0 ;
  float arg2 ;
  float arg3 ;
  float arg4 ;
  float arg5 ;
  ImColor result;
  
  arg1 = larg1;
  arg2 = larg2;
  arg3 = larg3;
  arg4 = larg4;
  arg5 = larg5;
  try {
    result = ImColor_HSV(arg1,arg2,arg3,arg4,arg5);
    lresult = new ImColor(result);
    return lresult;
  } catch (...) {
    return (ImColor *)0;
  }
}